

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O2

size_t boost::detail::dynamic_bitset_impl::
       do_count<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  first,size_t length,int param_3,value_to_type<true> *param_4)

{
  size_t sVar1;
  long lVar2;
  
  if (length != 0) {
    lVar2 = 0;
    sVar1 = 0;
    do {
      sVar1 = sVar1 + (byte)count_table<true>::table[*(byte *)((long)first._M_current + lVar2)];
      lVar2 = lVar2 + 1;
    } while (length * 8 != lVar2);
    return sVar1;
  }
  return 0;
}

Assistant:

inline std::size_t do_count(Iterator first, std::size_t length,
                                 int /*dummy param*/,
                                 value_to_type<access_by_bytes>* )
     {
         std::size_t num = 0;
         if (length)
         {
             const byte_type * p = object_representation(&*first);
             length *= sizeof(*first);

              do {
                 num += count_table<>::table[*p];
                 ++p;
                 --length;

             } while (length);
         }

         return num;
     }